

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::doExtract
          (UnicodeString *this,int32_t start,int32_t length,UChar *dst,int32_t dstStart)

{
  char16_t *src;
  UChar *array;
  int32_t dstStart_local;
  UChar *dst_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  dst_local._0_4_ = length;
  dst_local._4_4_ = start;
  _length_local = this;
  pinIndices(this,(int32_t *)((long)&dst_local + 4),(int32_t *)&dst_local);
  src = getArrayStart(this);
  if (src + dst_local._4_4_ != dst + dstStart) {
    us_arrayCopy(src,dst_local._4_4_,dst,dstStart,(int32_t)dst_local);
  }
  return;
}

Assistant:

void
UnicodeString::doExtract(int32_t start,
             int32_t length,
             UChar *dst,
             int32_t dstStart) const
{
  // pin indices to legal values
  pinIndices(start, length);

  // do not copy anything if we alias dst itself
  const UChar *array = getArrayStart();
  if(array + start != dst + dstStart) {
    us_arrayCopy(array, start, dst, dstStart, length);
  }
}